

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bignum.c
# Opt level: O0

sexp sexp_bignum_quot_rem(sexp ctx,sexp_conflict *rem,sexp a,sexp b)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  int offset;
  sexp_uint_t sVar5;
  sexp psVar6;
  sexp_sint_t sVar7;
  undefined8 in_RCX;
  long in_RDX;
  ulong *in_RSI;
  long in_RDI;
  undefined1 auVar8 [16];
  sexp_gc_var_t __sexp_gc_preserver5;
  sexp b1;
  sexp_gc_var_t __sexp_gc_preserver4;
  sexp a1;
  sexp_gc_var_t __sexp_gc_preserver3;
  sexp y;
  sexp_gc_var_t __sexp_gc_preserver2;
  sexp x;
  sexp_gc_var_t __sexp_gc_preserver1;
  sexp q;
  sexp_sint_t off;
  sexp_sint_t sign;
  sexp_sint_t blen;
  sexp_sint_t alen;
  sexp_uint_t dhi;
  sexp_uint_t dlo;
  sexp_luint_t dd;
  sexp_luint_t dn;
  sexp_luint_t d;
  sexp in_stack_fffffffffffffef8;
  undefined1 *local_100;
  sexp in_stack_ffffffffffffff08;
  sexp b_00;
  sexp psVar9;
  sexp in_stack_ffffffffffffff18;
  sexp in_stack_ffffffffffffff20;
  sexp ctx_00;
  undefined1 local_d8 [4];
  char cVar10;
  undefined3 uVar12;
  int iVar11;
  undefined8 b_01;
  undefined8 a_00;
  undefined8 uVar13;
  undefined8 local_b8 [2];
  undefined1 local_a8 [24];
  undefined8 a_01;
  undefined8 ctx_01;
  undefined8 in_stack_ffffffffffffff90;
  undefined8 in_stack_ffffffffffffff98;
  undefined8 in_stack_ffffffffffffffa0;
  undefined8 local_58;
  undefined8 local_50;
  undefined8 local_48;
  undefined8 local_8;
  
  sVar5 = sexp_bignum_hi((sexp)in_RCX);
  ctx_01 = &DAT_00000001;
  a_01 = (sexp)0x0;
  memset(local_a8 + 8,0,0x10);
  local_a8._0_8_ = &DAT_0000043e;
  memset(local_b8,0,0x10);
  uVar13 = &DAT_0000043e;
  memset(&stack0xffffffffffffff30,0,0x10);
  local_d8 = (undefined1  [4])0x43e;
  cVar10 = '\0';
  uVar12 = 0;
  memset(&stack0xffffffffffffff18,0,0x10);
  psVar9 = (sexp)&DAT_0000043e;
  memset(&local_100,0,0x10);
  if ((sVar5 == 1) && (*(sexp_conflict *)(in_RCX + 0x18) == (sexp_conflict)0x0)) {
    local_8 = sexp_xtype_exception
                        (in_stack_ffffffffffffff20,in_stack_ffffffffffffff18,(char *)psVar9,
                         in_stack_ffffffffffffff08);
  }
  else {
    local_a8._8_8_ = &stack0xffffffffffffff70;
    local_a8._16_8_ = *(undefined8 *)(in_RDI + 0x6080);
    *(undefined1 **)(in_RDI + 0x6080) = local_a8 + 8;
    local_b8[0] = local_a8;
    local_b8[1] = *(undefined8 *)(in_RDI + 0x6080);
    *(undefined8 **)(in_RDI + 0x6080) = local_b8;
    b_01 = &stack0xffffffffffffff40;
    a_00 = *(undefined8 *)(in_RDI + 0x6080);
    *(undefined1 **)(in_RDI + 0x6080) = &stack0xffffffffffffff30;
    psVar6 = (sexp)local_d8;
    ctx_00 = *(sexp *)(in_RDI + 0x6080);
    *(undefined1 **)(in_RDI + 0x6080) = &stack0xffffffffffffff18;
    local_100 = &stack0xffffffffffffff10;
    b_00 = *(sexp *)(in_RDI + 0x6080);
    *(undefined1 ***)(in_RDI + 0x6080) = &local_100;
    _local_d8 = sexp_copy_bignum(ctx_00,psVar6,psVar9,(sexp_uint_t)b_00);
    (_local_d8->value).flonum_bits[0] = '\x01';
    if (sVar5 == 1) {
      psVar6 = sexp_make_bignum(psVar9,(sexp_uint_t)b_00);
      psVar9 = _local_d8;
      iVar11 = (int)((ulong)_local_d8 >> 0x20);
      offset = iVar11;
      _local_d8 = psVar9;
      sVar5 = sexp_bignum_fxdiv((sexp)uVar13,(sexp)a_00,b_01,offset);
      (psVar6->value).string.length = sVar5;
      psVar9 = sexp_bignum_normalize(in_stack_fffffffffffffef8);
      *in_RSI = (ulong)psVar9;
      if ((int)*(char *)(in_RDX + 8) *
          (int)((anon_union_24768_35_b8e82fc1_for_value *)(in_RCX + 8))->flonum_bits[0] < 0) {
        if ((((ulong)_local_d8 & 3) == 0) && (_local_d8->tag == 0xc)) {
          (_local_d8->value).flonum_bits[0] = -(_local_d8->value).flonum_bits[0];
        }
        else if (((ulong)_local_d8 & 1) == 1) {
          auVar1._8_8_ = (long)_local_d8 >> 0x3f;
          auVar1._0_8_ = (ulong)_local_d8 & 0xfffffffffffffffe;
          _local_d8 = (sexp)(SUB168(auVar1 / SEXT816(2),0) * -2 | 1);
        }
      }
      if (*(char *)(in_RDX + 8) < '\0') {
        if (((*in_RSI & 3) == 0) && (*(int *)*in_RSI == 0xc)) {
          *(char *)(*in_RSI + 8) = -*(char *)(*in_RSI + 8);
        }
        else if ((*in_RSI & 1) == 1) {
          auVar2._8_8_ = (long)*in_RSI >> 0x3f;
          auVar2._0_8_ = *in_RSI & 0xfffffffffffffffe;
          *in_RSI = SUB168(auVar2 / SEXT816(2),0) * -2 | 1;
        }
      }
      *(undefined8 *)(in_RDI + 0x6080) = local_a8._16_8_;
      local_8 = _local_d8;
    }
    else {
      psVar9 = sexp_copy_bignum(ctx_00,psVar6,psVar9,(sexp_uint_t)b_00);
      (psVar9->value).flonum_bits[0] = '\x01';
      local_8 = &DAT_00000001;
      local_a8._0_8_ = sexp_make_bignum(psVar9,(sexp_uint_t)b_00);
      auVar8._8_8_ = in_stack_ffffffffffffff98;
      auVar8._0_8_ = in_stack_ffffffffffffffa0;
      while (sVar7 = sexp_bignum_compare_abs(psVar6,psVar9), -1 < sVar7) {
        in_stack_ffffffffffffff90 = sexp_bignum_hi(_local_d8);
        *(undefined8 *)((long)(local_a8._0_8_ + 8) + a_01 * 8 + 0x10) = 0;
        if (0 < (long)a_01) {
          *(undefined8 *)((long)(local_a8._0_8_ + 8) + a_01 * 8 + 8) = 0;
        }
        a_01 = in_stack_ffffffffffffff90 + (1 - sVar5);
        local_48 = *(ulong *)((long)&_local_d8->value + in_stack_ffffffffffffff90 * 8);
        uVar13 = *(ulong *)((long)&_local_d8->value + in_stack_ffffffffffffff90 * 8 + 8);
        local_58 = *(ulong *)((long)&psVar9->value + sVar5 * 8);
        local_50 = *(ulong *)((long)&psVar9->value + sVar5 * 8 + 8);
        if ((((2 < (long)in_stack_ffffffffffffff90) && (2 < (long)sVar5)) &&
            (*(int *)((long)&_local_d8->value + in_stack_ffffffffffffff90 * 8 + 0xc) == 0)) &&
           (*(int *)((long)&psVar9->value + sVar5 * 8 + 0xc) == 0)) {
          uVar13 = uVar13 << 0x20 | (ulong)local_48 >> 0x20;
          local_48 = local_48 << 0x20 |
                     (ulong)*(uint *)(&_local_d8->markedp + in_stack_ffffffffffffff90 * 8);
          local_50 = local_50 << 0x20 | (ulong)local_58 >> 0x20;
          local_58 = local_58 << 0x20 | (ulong)*(uint *)(&psVar9->markedp + sVar5 * 8);
        }
        auVar8 = __udivti3(local_48,uVar13,local_58,local_50);
        if (auVar8._0_8_ == 0 && auVar8._8_8_ == 0) {
          local_48 = *(ulong *)((long)&_local_d8->value + in_stack_ffffffffffffff90 * 8);
          uVar13 = *(ulong *)((long)&_local_d8->value + in_stack_ffffffffffffff90 * 8 + 8);
          local_58 = *(ulong *)((long)&psVar9->value + sVar5 * 8 + 8);
          local_50 = (sexp_mark_stack_ptr_t *)0x0;
          if ((*(int *)((long)&_local_d8->value + in_stack_ffffffffffffff90 * 8 + 0xc) == 0) &&
             (*(int *)((long)&psVar9->value + sVar5 * 8 + 0xc) == 0)) {
            uVar13 = uVar13 << 0x20 | (ulong)local_48 >> 0x20;
            local_48 = local_48 << 0x20 |
                       (ulong)*(uint *)(&_local_d8->markedp + in_stack_ffffffffffffff90 * 8);
            local_50 = (ulong)local_58 >> 0x20;
            local_58 = local_58 << 0x20 | (ulong)*(uint *)((long)&psVar9->value + sVar5 * 8 + 4);
          }
          auVar8 = __udivti3(local_48,uVar13,local_58,local_50);
          a_01 = a_01 - 1;
        }
        *(long *)((long)(local_a8._0_8_ + 8) + a_01 * 8 + 0x10) = auVar8._8_8_;
        if (0 < (long)a_01) {
          *(long *)((long)(local_a8._0_8_ + 8) + a_01 * 8 + 8) = auVar8._0_8_;
        }
        sexp_bignum_mul((sexp)in_RCX,(sexp)auVar8._8_8_,(sexp)auVar8._0_8_,(sexp)uVar13);
        if ((long)ctx_01 < 0) {
          _local_d8 = sexp_bignum_add(ctx_00,psVar6,psVar9,b_00);
          local_8 = sexp_sub((sexp)auVar8._0_8_,(sexp)auVar8._8_8_,(sexp)in_stack_ffffffffffffff90);
        }
        else {
          _local_d8 = sexp_bignum_sub(ctx_00,psVar6,psVar9,b_00);
          local_8 = sexp_add((sexp)ctx_01,(sexp)a_01,(sexp)local_8);
        }
        if ((sexp)(long)(_local_d8->value).flonum_bits[0] != (sexp)ctx_01) {
          (_local_d8->value).flonum_bits[0] = -(char)ctx_01;
          ctx_01 = -ctx_01;
        }
      }
      _local_d8 = sexp_bignum_normalize(in_stack_fffffffffffffef8);
      if (((long)ctx_01 < 0) && (_local_d8 != (sexp)&DAT_00000001)) {
        local_8 = sexp_sub((sexp)auVar8._0_8_,(sexp)auVar8._8_8_,(sexp)in_stack_ffffffffffffff90);
        _local_d8 = sexp_add((sexp)ctx_01,(sexp)a_01,(sexp)local_8);
      }
      *in_RSI = (ulong)_local_d8;
      if ((int)*(char *)(in_RDX + 8) *
          (int)((anon_union_24768_35_b8e82fc1_for_value *)(in_RCX + 8))->flonum_bits[0] < 0) {
        if (((local_8 & 3) == 0) && (((sexp)local_8)->tag == 0xc)) {
          (((sexp)local_8)->value).flonum_bits[0] = -(((sexp)local_8)->value).flonum_bits[0];
        }
        else if ((local_8 & 1) == 1) {
          auVar3._8_8_ = (long)local_8 >> 0x3f;
          auVar3._0_8_ = local_8 & 0xfffffffffffffffe;
          local_8 = SUB168(auVar3 / SEXT816(2),0) * -2 | 1;
        }
      }
      if (*(char *)(in_RDX + 8) < '\0') {
        if (((*in_RSI & 3) == 0) && (*(int *)*in_RSI == 0xc)) {
          *(char *)(*in_RSI + 8) = -*(char *)(*in_RSI + 8);
        }
        else if ((*in_RSI & 1) == 1) {
          auVar4._8_8_ = (long)*in_RSI >> 0x3f;
          auVar4._0_8_ = *in_RSI & 0xfffffffffffffffe;
          *in_RSI = SUB168(auVar4 / SEXT816(2),0) * -2 | 1;
        }
      }
      *(undefined8 *)(in_RDI + 0x6080) = local_a8._16_8_;
    }
  }
  return (sexp)local_8;
}

Assistant:

sexp sexp_bignum_quot_rem (sexp ctx, sexp *rem, sexp a, sexp b) {
  sexp_luint_t d, dn, dd;
  sexp_uint_t dlo, dhi;
  sexp_sint_t alen, blen=sexp_bignum_hi(b), sign=1, off=0;
  sexp_gc_var5(q, x, y, a1, b1);
  if (blen == 1 && sexp_bignum_data(b)[0] == 0)
    return sexp_xtype_exception(ctx, NULL, "divide by zero", a);
  sexp_gc_preserve5(ctx, q, x, y, a1, b1);
  a1 = sexp_copy_bignum(ctx, NULL, a, 0);
  sexp_bignum_sign(a1) = 1;
  /* fast path for single bigit divisor */
  if (blen == 1) {
    b1 = sexp_make_bignum(ctx, 1);
    sexp_bignum_data(b1)[0] = sexp_bignum_fxdiv(ctx, a1, sexp_bignum_data(b)[0], 0);
    *rem = sexp_bignum_normalize(b1);
    if (sexp_bignum_sign(a) * sexp_bignum_sign(b) < 0) {
      sexp_negate_exact(a1);
    }
    if (sexp_bignum_sign(a) < 0) {
      sexp_negate_exact(*rem);
    }
    sexp_gc_release5(ctx);
    return a1;
  }
  /* general case */
  b1 = sexp_copy_bignum(ctx, NULL, b, 0);
  sexp_bignum_sign(b1) = 1;
  q = SEXP_ZERO;
  x = sexp_make_bignum(ctx, sexp_bignum_length(a));
  while (sexp_bignum_compare_abs(a1, b1) >= 0) { /* a1, b1 at least 2 bigits */
    /* guess divisor x */
    alen = sexp_bignum_hi(a1);
    sexp_bignum_data(x)[off] = 0;
    if (off > 0) sexp_bignum_data(x)[off-1] = 0;
    off = alen - blen + 1;
    dn = luint_add_uint(luint_shl(luint_from_uint(sexp_bignum_data(a1)[alen-1])
           , (sizeof(sexp_uint_t)*8))
          , sexp_bignum_data(a1)[alen-2]);
    dd = luint_add_uint(luint_shl(luint_from_uint(sexp_bignum_data(b1)[blen-1])
           , (sizeof(sexp_uint_t)*8))
          , sexp_bignum_data(b1)[blen-2]);
    if (alen > 2 && blen > 2 &&
        luint_lt(luint_from_uint(sexp_bignum_data(a1)[alen-1]), luint_shl(luint_from_uint(1), (sizeof(sexp_uint_t)*4))) &&
        luint_lt(luint_from_uint(sexp_bignum_data(b1)[blen-1]), luint_shl(luint_from_uint(1), (sizeof(sexp_uint_t)*4)))) {
      dn = luint_add_uint(luint_shl(dn, (sizeof(sexp_uint_t)*4))
        , (sexp_bignum_data(a1)[alen-3] >> (sizeof(sexp_uint_t)*4)));
      dd = luint_add_uint(luint_shl(dd, (sizeof(sexp_uint_t)*4))
        , (sexp_bignum_data(b1)[blen-3] >> (sizeof(sexp_uint_t)*4)));
    }
    d = luint_div(dn, dd);
    if (luint_eq(d, luint_from_uint(0))) {
      dn = luint_add_uint(luint_shl(luint_from_uint(sexp_bignum_data(a1)[alen-1])
             , (sizeof(sexp_uint_t)*8))
            , sexp_bignum_data(a1)[alen-2]);
      dd = luint_from_uint(sexp_bignum_data(b1)[blen-1]);
      if (luint_lt(luint_from_uint(sexp_bignum_data(a1)[alen-1]), (luint_shl(luint_from_uint(1), (sizeof(sexp_uint_t)*4)))) &&
          luint_lt(luint_from_uint(sexp_bignum_data(b1)[blen-1]), (luint_shl(luint_from_uint(1), (sizeof(sexp_uint_t)*4))))) {
        dn = luint_add_uint(luint_shl(dn, (sizeof(sexp_uint_t)*4))
          , (sexp_bignum_data(a1)[alen-3] >> (sizeof(sexp_uint_t)*4)));
        dd = luint_add_uint(luint_shl(dd, (sizeof(sexp_uint_t)*4))
          , (sexp_bignum_data(b1)[blen-2] >> (sizeof(sexp_uint_t)*4)));
      }
      d = luint_div(dn, dd);
      off--;
    }
    dhi = luint_to_uint(luint_shr(d, (sizeof(sexp_uint_t)*8)));
    dlo = luint_to_uint(luint_and(d, luint_sub(luint_shl(luint_from_uint(1), (sizeof(sexp_uint_t)*8)), luint_from_uint(1))));
    sexp_bignum_data(x)[off] = dhi;
    if (off > 0) sexp_bignum_data(x)[off-1] = dlo;
    /* update quotient q and remainder a1 estimates */
    y = sexp_bignum_mul(ctx, NULL, b1, x);
    if (sign < 0) {
      a1 = sexp_bignum_add(ctx, NULL, a1, y);
      q = sexp_sub(ctx, q, x);
    } else {
      a1 = sexp_bignum_sub(ctx, NULL, a1, y);
      q = sexp_add(ctx, q, x);
    }
    /* flip the sign if we overshot in our estimate */
    if (sexp_bignum_sign(a1) != sign) {
      sexp_bignum_sign(a1) = (char)(-sign);
      sign *= -1;
    }
  }
  /* adjust signs */
  a1 = sexp_bignum_normalize(a1);
  if (sign < 0 && a1 != SEXP_ZERO) {
    q = sexp_sub(ctx, q, SEXP_ONE);
    a1 = sexp_add(ctx, a1, b1);
  }
  *rem = a1;
  if (sexp_bignum_sign(a) * sexp_bignum_sign(b) < 0) {
    sexp_negate_exact(q);
  }
  if (sexp_bignum_sign(a) < 0) {
    sexp_negate_exact(*rem);
  }
  sexp_gc_release5(ctx);
  return q;
}